

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char_*,_unsigned_long,_const_char_*,_const_char_*>
* __thiscall
fmt::v7::make_args_checked<char_const*,unsigned_long,char_const*,char_const*,char[16],char>
          (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char_*,_unsigned_long,_const_char_*,_const_char_*>
           *__return_storage_ptr__,v7 *this,char (*format_str) [16],
          remove_reference_t<const_char_*> *args,remove_reference_t<unsigned_long> *args_1,
          remove_reference_t<const_char_*> *args_2,remove_reference_t<const_char_*> *args_3)

{
  remove_reference_t<const_char_*> *args_local_3;
  remove_reference_t<const_char_*> *args_local_2;
  remove_reference_t<unsigned_long> *args_local_1;
  remove_reference_t<const_char_*> *args_local;
  char (*format_str_local) [16];
  
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_char_*,_unsigned_long,_const_char_*,_const_char_*>
  ::format_arg_store(__return_storage_ptr__,(char **)format_str,(unsigned_long *)args,
                     (char **)args_1,args_2);
  return __return_storage_ptr__;
}

Assistant:

inline auto make_args_checked(const S& format_str,
                              const remove_reference_t<Args>&... args)
    -> format_arg_store<buffer_context<Char>, remove_reference_t<Args>...> {
  static_assert(
      detail::count<(
              std::is_base_of<detail::view, remove_reference_t<Args>>::value &&
              std::is_reference<Args>::value)...>() == 0,
      "passing views as lvalues is disallowed");
  detail::check_format_string<Args...>(format_str);
  return {args...};
}